

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

void * upb_Message_ResizeArrayUninitialized
                 (upb_Message *msg,upb_MiniTableField *f,size_t size,upb_Arena *arena)

{
  _Bool _Var1;
  upb_Array *array;
  void *pvVar2;
  upb_Array *arr;
  upb_Arena *arena_local;
  size_t size_local;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  
  _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
  array = upb_Message_GetOrCreateMutableArray(msg,f,arena);
  if ((array != (upb_Array *)0x0) &&
     (_Var1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(array,size,arena),
     _Var1)) {
    pvVar2 = upb_Array_MutableDataPtr(array);
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

UPB_API_INLINE void* upb_Message_ResizeArrayUninitialized(
    struct upb_Message* msg, const upb_MiniTableField* f, size_t size,
    upb_Arena* arena) {
  UPB_PRIVATE(_upb_MiniTableField_CheckIsArray)(f);
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(msg, f, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(arr, size, arena)) {
    return NULL;
  }
  return upb_Array_MutableDataPtr(arr);
}